

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

int __thiscall xray_re::_lzhuf::GetByte(_lzhuf *this)

{
  uint uVar1;
  FILE *in_RSI;
  int local_24;
  int c;
  uint i;
  _lzhuf *this_local;
  
  while (this->getlen < 9) {
    local_24 = getc(this,in_RSI);
    if (local_24 < 0) {
      local_24 = 0;
    }
    in_RSI = (FILE *)(ulong)this->getlen;
    this->getbuf = local_24 << (8 - this->getlen & 0x1f) | this->getbuf;
    this->getlen = this->getlen + '\b';
  }
  uVar1 = this->getbuf;
  this->getbuf = this->getbuf << 8;
  this->getlen = this->getlen + 0xf8;
  return (uVar1 & 0xff00) >> 8;
}

Assistant:

int _lzhuf::GetByte(void)	/* get one byte */
{
	unsigned i;

	while (getlen <= 8) {
		int c = getc();
		i = (c < 0) ? 0 : c;
		getbuf |= i << (8 - getlen);
		getlen += 8;
	}
	i = getbuf;
	getbuf <<= 8;
	getlen -= 8;
	return (i & 0xff00) >> 8;
}